

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  U32 lowestValid;
  ulong *puVar6;
  ulong uVar7;
  seqDef *psVar8;
  ulong *puVar9;
  ulong *puVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong *puVar18;
  uint uVar19;
  ulong *puVar20;
  BYTE *pBVar21;
  BYTE *litEnd;
  uint uVar22;
  ulong uVar23;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  uint local_b8;
  uint local_b4;
  size_t local_b0;
  ZSTD_matchState_t *local_a8;
  ulong *local_a0;
  ulong *local_98;
  uint local_8c;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  seqStore_t *local_58;
  ulong *local_50;
  uint *local_48;
  BYTE *local_40;
  long local_38;
  
  puVar18 = (ulong *)((long)src + srcSize);
  pBVar21 = (ms->window).base;
  uVar22 = (ms->window).dictLimit;
  local_40 = pBVar21 + uVar22;
  uVar19 = (ms->cParams).minMatch;
  uVar14 = 6;
  if (uVar19 < 6) {
    uVar14 = uVar19;
  }
  local_8c = 4;
  if (4 < uVar14) {
    local_8c = uVar14;
  }
  local_5c = *rep;
  puVar20 = (ulong *)((ulong)((int)src == (int)local_40) + (long)src);
  iVar12 = (int)puVar20 - (int)pBVar21;
  uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_60 = iVar12 - uVar19;
  if (iVar12 - uVar22 <= uVar19) {
    local_60 = uVar22;
  }
  if (ms->loadedDictEnd != 0) {
    local_60 = uVar22;
  }
  local_64 = rep[1];
  local_60 = iVar12 - local_60;
  local_b4 = local_64;
  if (local_60 < local_64) {
    local_b4 = 0;
  }
  uVar22 = local_5c;
  if (local_60 < local_5c) {
    uVar22 = 0;
  }
  uVar23 = (ulong)uVar22;
  local_98 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (puVar20 < local_98) {
    puVar10 = (ulong *)((long)puVar18 + -7);
    local_70 = (ulong *)((long)puVar18 + -3);
    local_78 = (ulong *)((long)puVar18 + -1);
    local_50 = puVar18 + -4;
    local_a8 = ms;
    local_a0 = puVar10;
    local_88 = puVar18;
    local_58 = seqStore;
    local_48 = rep;
    do {
      uVar22 = (uint)uVar23;
      local_38 = -uVar23;
      if (uVar22 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        if (*(int *)(((long)puVar20 + 1) - uVar23) == *(int *)((long)puVar20 + 1)) {
          puVar2 = (ulong *)((long)puVar20 + 5);
          puVar9 = (ulong *)((long)puVar20 + local_38 + 5);
          puVar6 = puVar2;
          if (puVar2 < puVar10) {
            if (*puVar9 == *puVar2) {
              lVar11 = 0;
              do {
                puVar6 = (ulong *)((long)puVar20 + lVar11 + 0xd);
                if (puVar10 <= puVar6) {
                  puVar9 = (ulong *)((long)puVar20 + local_38 + lVar11 + 0xd);
                  puVar6 = (ulong *)((long)puVar20 + lVar11 + 0xd);
                  goto LAB_0014faba;
                }
                uVar13 = *(ulong *)((long)puVar20 + lVar11 + local_38 + 0xd);
                uVar17 = *puVar6;
                lVar11 = lVar11 + 8;
              } while (uVar13 == uVar17);
              uVar17 = uVar17 ^ uVar13;
              uVar13 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar11;
            }
            else {
              uVar17 = *puVar2 ^ *puVar9;
              uVar13 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = uVar13 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0014faba:
            if ((puVar6 < local_70) && ((int)*puVar9 == (int)*puVar6)) {
              puVar6 = (ulong *)((long)puVar6 + 4);
              puVar9 = (ulong *)((long)puVar9 + 4);
            }
            if ((puVar6 < local_78) && ((short)*puVar9 == (short)*puVar6)) {
              puVar6 = (ulong *)((long)puVar6 + 2);
              puVar9 = (ulong *)((long)puVar9 + 2);
            }
            if (puVar6 < puVar18) {
              puVar6 = (ulong *)((long)puVar6 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar6));
            }
            uVar13 = (long)puVar6 - (long)puVar2;
          }
          uVar13 = uVar13 + 4;
        }
      }
      local_b0 = 999999999;
      if (local_8c == 6) {
        uVar17 = ZSTD_HcFindBestMatch_noDict_6(local_a8,(BYTE *)puVar20,(BYTE *)puVar18,&local_b0);
      }
      else if (local_8c == 5) {
        uVar17 = ZSTD_HcFindBestMatch_noDict_5(local_a8,(BYTE *)puVar20,(BYTE *)puVar18,&local_b0);
      }
      else {
        uVar17 = ZSTD_HcFindBestMatch_noDict_4(local_a8,(BYTE *)puVar20,(BYTE *)puVar18,&local_b0);
      }
      uVar7 = uVar13;
      if (uVar13 < uVar17) {
        uVar7 = uVar17;
      }
      if (uVar7 < 4) {
        uVar13 = (long)puVar20 - (long)src;
        puVar20 = (ulong *)((long)puVar20 + (uVar13 >> 8) + 1);
        local_a8->lazySkipping = (uint)(0x7ff < uVar13);
        puVar10 = local_a0;
      }
      else {
        puVar10 = puVar20;
        uVar23 = local_b0;
        if (uVar17 <= uVar13) {
          puVar10 = (ulong *)((long)puVar20 + 1);
          uVar23 = 1;
        }
        uVar13 = uVar7;
        if (puVar20 < local_98) {
          puVar18 = (ulong *)((long)puVar20 + 0xd);
          local_b0 = uVar23;
          local_80 = puVar10;
          do {
            puVar2 = (ulong *)((long)puVar20 + 1);
            uVar13 = uVar7;
            if (local_b0 == 0) {
              uVar23 = 0;
            }
            else {
              uVar23 = local_b0;
              if ((uVar22 != 0) && (*(int *)puVar2 == *(int *)((long)puVar2 + local_38))) {
                puVar10 = (ulong *)((long)puVar20 + local_38 + 5);
                puVar20 = (ulong *)((long)puVar20 + 5);
                puVar6 = puVar20;
                if (puVar20 < local_a0) {
                  puVar6 = puVar18;
                  if (*puVar10 == *puVar20) {
                    do {
                      if (local_a0 <= puVar6) {
                        puVar10 = (ulong *)((long)puVar6 + local_38);
                        goto LAB_0014fc6f;
                      }
                      puVar10 = (ulong *)((long)puVar6 + local_38);
                      uVar17 = *puVar6;
                      puVar6 = puVar6 + 1;
                    } while (*puVar10 == uVar17);
                    uVar17 = uVar17 ^ *puVar10;
                    uVar15 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    puVar6 = (ulong *)((long)puVar6 + ((uVar15 >> 3 & 0x1fffffff) - 8));
                    goto LAB_0014fcad;
                  }
                  uVar15 = *puVar20 ^ *puVar10;
                  uVar17 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = uVar17 >> 3 & 0x1fffffff;
                }
                else {
LAB_0014fc6f:
                  if ((puVar6 < local_70) && ((int)*puVar10 == (int)*puVar6)) {
                    puVar6 = (ulong *)((long)puVar6 + 4);
                    puVar10 = (ulong *)((long)puVar10 + 4);
                  }
                  if ((puVar6 < local_78) && ((short)*puVar10 == (short)*puVar6)) {
                    puVar6 = (ulong *)((long)puVar6 + 2);
                    puVar10 = (ulong *)((long)puVar10 + 2);
                  }
                  if (puVar6 < local_88) {
                    puVar6 = (ulong *)((long)puVar6 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar6));
                  }
LAB_0014fcad:
                  uVar17 = (long)puVar6 - (long)puVar20;
                  if (0xfffffffffffffffb < uVar17) goto LAB_0014fcdd;
                }
                uVar19 = 0x1f;
                if ((uint)local_b0 != 0) {
                  for (; (uint)local_b0 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                  }
                }
                if ((int)((uVar19 ^ 0x1f) + (int)uVar7 * 3 + -0x1e) < (int)(uVar17 + 4) * 3) {
                  uVar23 = 1;
                  uVar13 = uVar17 + 4;
                  local_80 = puVar2;
                }
              }
            }
LAB_0014fcdd:
            local_b0 = 999999999;
            if (local_8c == 6) {
              uVar7 = ZSTD_HcFindBestMatch_noDict_6
                                (local_a8,(BYTE *)puVar2,(BYTE *)local_88,&local_b0);
            }
            else if (local_8c == 5) {
              uVar7 = ZSTD_HcFindBestMatch_noDict_5
                                (local_a8,(BYTE *)puVar2,(BYTE *)local_88,&local_b0);
            }
            else {
              uVar7 = ZSTD_HcFindBestMatch_noDict_4
                                (local_a8,(BYTE *)puVar2,(BYTE *)local_88,&local_b0);
            }
            puVar10 = local_80;
            if (uVar7 < 4) break;
            uVar19 = 0x1f;
            if ((uint)uVar23 != 0) {
              for (; (uint)uVar23 >> uVar19 == 0; uVar19 = uVar19 - 1) {
              }
            }
            iVar12 = 0x1f;
            if ((uint)local_b0 != 0) {
              for (; (uint)local_b0 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            if (((int)uVar7 * 4 - iVar12 <= (int)((uVar19 ^ 0x1f) + (int)uVar13 * 4 + -0x1b)) ||
               (puVar18 = (ulong *)((long)puVar18 + 1), uVar13 = uVar7, puVar20 = puVar2,
               puVar10 = puVar2, uVar23 = local_b0, local_80 = puVar2, local_98 <= puVar2)) break;
          } while( true );
        }
        psVar5 = local_58;
        local_b8 = uVar22;
        if (3 < uVar23) {
          if ((src < puVar10) && (local_40 < (BYTE *)((long)puVar10 + (3 - uVar23)))) {
            puVar18 = puVar10;
            while (puVar10 = puVar18,
                  *(BYTE *)((long)puVar18 - 1) == *(BYTE *)((long)puVar18 + (2 - uVar23))) {
              puVar10 = (ulong *)((long)puVar18 - 1);
              uVar13 = uVar13 + 1;
              if ((puVar10 <= src) ||
                 (pBVar21 = (BYTE *)((long)puVar18 + (2 - uVar23)), puVar18 = puVar10,
                 pBVar21 <= local_40)) break;
            }
          }
          local_b8 = (U32)uVar23 - 3;
          local_b4 = uVar22;
        }
        if (local_58->maxNbSeq <=
            (ulong)((long)local_58->sequences - (long)local_58->sequencesStart >> 3)) {
LAB_0015023f:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_58->maxNbLit) {
LAB_0015025e:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar17 = (long)puVar10 - (long)src;
        puVar18 = (ulong *)local_58->lit;
        if (local_58->litStart + local_58->maxNbLit < (BYTE *)((long)puVar18 + uVar17)) {
LAB_00150220:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_88 < puVar10) {
LAB_00150201:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar10) {
          ZSTD_safecopyLiterals((BYTE *)puVar18,(BYTE *)src,(BYTE *)puVar10,(BYTE *)local_50);
LAB_0014fe76:
          psVar5->lit = psVar5->lit + uVar17;
          if (0xffff < uVar17) {
            if (psVar5->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            psVar5->longLengthType = ZSTD_llt_literalLength;
            psVar5->longLengthPos =
                 (U32)((ulong)((long)psVar5->sequences - (long)psVar5->sequencesStart) >> 3);
          }
        }
        else {
          uVar7 = *(ulong *)((long)src + 8);
          *puVar18 = *src;
          puVar18[1] = uVar7;
          pBVar21 = local_58->lit;
          if (0x10 < uVar17) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar21 + 0x18) = uVar7;
            if (0x20 < (long)uVar17) {
              lVar11 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar11 + 0x20);
                uVar4 = puVar3[1];
                pBVar1 = pBVar21 + lVar11 + 0x20;
                *(undefined8 *)pBVar1 = *puVar3;
                *(undefined8 *)(pBVar1 + 8) = uVar4;
                puVar3 = (undefined8 *)((long)src + lVar11 + 0x30);
                uVar4 = puVar3[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar1 + 0x18) = uVar4;
                lVar11 = lVar11 + 0x20;
              } while (pBVar1 + 0x20 < pBVar21 + uVar17);
            }
            goto LAB_0014fe76;
          }
          local_58->lit = pBVar21 + uVar17;
        }
        puVar18 = local_88;
        psVar8 = psVar5->sequences;
        psVar8->litLength = (U16)uVar17;
        psVar8->offBase = (U32)uVar23;
        if (uVar13 < 3) {
LAB_0015027d:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar13 - 3) {
          if (psVar5->longLengthType != ZSTD_llt_none) {
LAB_0015029c:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar5->longLengthType = ZSTD_llt_matchLength;
          psVar5->longLengthPos = (U32)((ulong)((long)psVar8 - (long)psVar5->sequencesStart) >> 3);
        }
        psVar8->mlBase = (U16)(uVar13 - 3);
        psVar8 = psVar8 + 1;
        psVar5->sequences = psVar8;
        if (local_a8->lazySkipping != 0) {
          local_a8->lazySkipping = 0;
        }
        puVar20 = (ulong *)((long)puVar10 + uVar13);
        puVar10 = local_a0;
        if ((local_b4 == 0) || (local_98 < puVar20)) {
          src = puVar20;
          uVar23 = (ulong)local_b8;
        }
        else {
          uVar23 = (ulong)local_b8;
          uVar13 = (ulong)local_b4;
          while( true ) {
            uVar17 = uVar13;
            uVar13 = uVar23;
            uVar22 = (uint)uVar13;
            src = puVar20;
            uVar23 = uVar13;
            local_b4 = (uint)uVar17;
            if ((int)*puVar20 != *(int *)((long)puVar20 - uVar17)) break;
            lVar11 = -uVar17;
            puVar2 = (ulong *)((long)puVar20 + 4);
            puVar9 = (ulong *)((long)puVar20 + lVar11 + 4);
            puVar6 = puVar2;
            if (puVar2 < puVar10) {
              if (*puVar9 == *puVar2) {
                lVar16 = 0;
                do {
                  puVar6 = (ulong *)((long)puVar20 + lVar16 + 0xc);
                  if (puVar10 <= puVar6) {
                    puVar9 = (ulong *)((long)puVar20 + lVar11 + lVar16 + 0xc);
                    puVar6 = (ulong *)((long)puVar20 + lVar16 + 0xc);
                    goto LAB_0015004d;
                  }
                  uVar23 = *(ulong *)((long)puVar20 + lVar16 + lVar11 + 0xc);
                  uVar7 = *puVar6;
                  lVar16 = lVar16 + 8;
                } while (uVar23 == uVar7);
                uVar7 = uVar7 ^ uVar23;
                uVar23 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar16;
              }
              else {
                uVar7 = *puVar2 ^ *puVar9;
                uVar23 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                uVar23 = uVar23 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0015004d:
              if ((puVar6 < local_70) && ((int)*puVar9 == (int)*puVar6)) {
                puVar6 = (ulong *)((long)puVar6 + 4);
                puVar9 = (ulong *)((long)puVar9 + 4);
              }
              if ((puVar6 < local_78) && ((short)*puVar9 == (short)*puVar6)) {
                puVar6 = (ulong *)((long)puVar6 + 2);
                puVar9 = (ulong *)((long)puVar9 + 2);
              }
              if (puVar6 < puVar18) {
                puVar6 = (ulong *)((long)puVar6 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar6));
              }
              uVar23 = (long)puVar6 - (long)puVar2;
            }
            if (psVar5->maxNbSeq <= (ulong)((long)psVar8 - (long)psVar5->sequencesStart >> 3))
            goto LAB_0015023f;
            if (0x20000 < psVar5->maxNbLit) goto LAB_0015025e;
            puVar2 = (ulong *)psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < puVar2) goto LAB_00150220;
            if (puVar18 < puVar20) goto LAB_00150201;
            if (local_50 < puVar20) {
              ZSTD_safecopyLiterals((BYTE *)puVar2,(BYTE *)puVar20,(BYTE *)puVar20,(BYTE *)local_50)
              ;
              puVar10 = local_a0;
            }
            else {
              uVar7 = puVar20[1];
              *puVar2 = *puVar20;
              puVar2[1] = uVar7;
            }
            psVar8 = psVar5->sequences;
            psVar8->litLength = 0;
            psVar8->offBase = 1;
            if (uVar23 + 4 < 3) goto LAB_0015027d;
            if (0xffff < uVar23 + 1) {
              if (psVar5->longLengthType != ZSTD_llt_none) goto LAB_0015029c;
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar8 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar8->mlBase = (U16)(uVar23 + 1);
            psVar8 = psVar8 + 1;
            psVar5->sequences = psVar8;
            puVar20 = (ulong *)((long)puVar20 + uVar23 + 4);
            src = puVar20;
            uVar23 = uVar17;
            local_b4 = uVar22;
            if ((uVar22 == 0) || (local_98 < puVar20)) break;
          }
        }
      }
      uVar22 = (uint)uVar23;
      rep = local_48;
    } while (puVar20 < local_98);
  }
  if (local_64 <= local_60) {
    local_64 = 0;
  }
  uVar19 = local_64;
  if (uVar22 != 0) {
    uVar19 = local_5c;
  }
  if (local_5c <= local_60) {
    uVar19 = local_64;
    local_5c = 0;
  }
  if (uVar22 != 0) {
    local_5c = uVar22;
  }
  if (local_b4 != 0) {
    uVar19 = local_b4;
  }
  *rep = local_5c;
  rep[1] = uVar19;
  return (long)puVar18 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_noDict);
}